

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

ImageFormatNormalizedState image_format_to_normalized_state(ImageFormat fmt)

{
  ImageFormatNormalizedState local_c;
  ImageFormat fmt_local;
  
  if (fmt == ImageFormatRgba8) {
LAB_002e5f18:
    local_c = Unorm;
  }
  else {
    if (fmt != ImageFormatRgba8Snorm) {
      if (fmt - ImageFormatRgba16 < 6) goto LAB_002e5f18;
      if (4 < fmt - ImageFormatRgba16Snorm) {
        return None;
      }
    }
    local_c = Snorm;
  }
  return local_c;
}

Assistant:

static ImageFormatNormalizedState image_format_to_normalized_state(ImageFormat fmt)
{
	switch (fmt)
	{
	case ImageFormatR8:
	case ImageFormatR16:
	case ImageFormatRg8:
	case ImageFormatRg16:
	case ImageFormatRgba8:
	case ImageFormatRgba16:
	case ImageFormatRgb10A2:
		return ImageFormatNormalizedState::Unorm;

	case ImageFormatR8Snorm:
	case ImageFormatR16Snorm:
	case ImageFormatRg8Snorm:
	case ImageFormatRg16Snorm:
	case ImageFormatRgba8Snorm:
	case ImageFormatRgba16Snorm:
		return ImageFormatNormalizedState::Snorm;

	default:
		break;
	}

	return ImageFormatNormalizedState::None;
}